

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *args)

{
  ushort uVar1;
  void *pvVar2;
  BYTE *pBVar3;
  code *pcVar4;
  code *pcVar5;
  bool bVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  BYTE *pBVar11;
  ulong uVar12;
  long lVar13;
  BYTE *ip [4];
  BYTE *op [4];
  U64 bits [4];
  code *apcStack_a0 [3];
  BYTE *local_88;
  BYTE *pBStack_80;
  BYTE *local_78 [4];
  U64 local_58 [5];
  
  pvVar2 = args->dt;
  pBVar3 = args->oend;
  pcVar4 = (code *)args->ilimit;
  local_58[2] = args->bits[2];
  local_58[3] = args->bits[3];
  local_58[0] = args->bits[0];
  local_58[1] = args->bits[1];
  apcStack_a0[1] = (code *)args->ip[0];
  apcStack_a0[2] = (code *)args->ip[1];
  local_88 = args->ip[2];
  pBStack_80 = args->ip[3];
  local_78[0] = args->op[0];
  local_78[1] = args->op[1];
  local_78[2] = args->op[2];
  local_78[3] = args->op[3];
  lVar10 = 0;
  do {
    do {
      pBVar11 = pBVar3;
      if (lVar10 != 3) {
        pBVar11 = local_78[lVar10 + 1];
      }
      if (pBVar11 < local_78[lVar10]) {
        apcStack_a0[0] = (code *)0x1c449c;
        __assert_fail("op[stream] <= (stream == 3 ? oend : op[stream + 1])",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8eff,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      if (apcStack_a0[lVar10 + 1] < pcVar4) {
        apcStack_a0[0] = HUF_decompress4X1_usingDTable_internal_bmi2;
        __assert_fail("ip[stream] >= ilimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8f00,
                      "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                     );
      }
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    uVar12 = (ulong)((long)pBVar3 - (long)local_78[3]) / 5;
    uVar9 = (ulong)((long)apcStack_a0[1] - (long)pcVar4) / 7;
    if (uVar12 < uVar9) {
      uVar9 = uVar12;
    }
    if ((long)(uVar9 * 5) < 0x14) {
      iVar8 = 2;
      bVar6 = false;
    }
    else {
      lVar10 = 1;
      do {
        bVar6 = apcStack_a0[lVar10 + 1] >= apcStack_a0[lVar10];
        if (apcStack_a0[lVar10 + 1] < apcStack_a0[lVar10]) {
          iVar8 = 10;
          goto LAB_001c4363;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      iVar8 = 0;
    }
LAB_001c4363:
    if (bVar6) {
      pBVar11 = local_78[3] + uVar9 * 5;
      lVar10 = 1;
      do {
        if (apcStack_a0[lVar10 + 1] < apcStack_a0[lVar10]) {
          apcStack_a0[0] = (code *)0x1c447d;
          __assert_fail("ip[stream] >= ip[stream - 1]",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x8f25,
                        "void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs *)"
                       );
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 != 4);
      lVar10 = 0;
      do {
        do {
          lVar13 = 0;
          do {
            uVar1 = *(ushort *)((long)pvVar2 + (local_58[lVar13] >> 0x35) * 2);
            local_58[lVar13] = local_58[lVar13] << ((ulong)uVar1 & 0x3f);
            local_78[lVar13][lVar10] = (BYTE)(uVar1 >> 8);
            lVar13 = lVar13 + 1;
          } while (lVar13 != 4);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 5);
        lVar10 = 0;
        do {
          uVar7 = 0;
          for (uVar9 = local_58[lVar10]; (uVar9 & 1) == 0; uVar9 = uVar9 >> 1 | 0x8000000000000000)
          {
            uVar7 = uVar7 + 1;
          }
          local_78[lVar10] = local_78[lVar10] + 5;
          pcVar5 = apcStack_a0[lVar10 + 1];
          apcStack_a0[lVar10 + 1] = pcVar5 + -(ulong)(uVar7 >> 3);
          local_58[lVar10] = (*(ulong *)(pcVar5 + -(ulong)(uVar7 >> 3)) | 1) << ((byte)uVar7 & 7);
          lVar10 = lVar10 + 1;
        } while (lVar10 != 4);
        lVar10 = 0;
        iVar8 = 0;
      } while (local_78[3] < pBVar11);
    }
    lVar10 = 0;
    if (iVar8 != 0) {
      args->bits[2] = local_58[2];
      args->bits[3] = local_58[3];
      args->bits[0] = local_58[0];
      args->bits[1] = local_58[1];
      args->ip[2] = local_88;
      args->ip[3] = pBStack_80;
      args->ip[0] = (BYTE *)apcStack_a0[1];
      args->ip[1] = (BYTE *)apcStack_a0[2];
      args->op[2] = local_78[2];
      args->op[3] = local_78[3];
      args->op[0] = local_78[0];
      args->op[1] = local_78[1];
      return;
    }
  } while( true );
}

Assistant:

static HUF_FAST_BMI2_ATTRS
void HUF_decompress4X1_usingDTable_internal_fast_c_loop(HUF_DecompressFastArgs* args)
{
    U64 bits[4];
    BYTE const* ip[4];
    BYTE* op[4];
    U16 const* const dtable = (U16 const*)args->dt;
    BYTE* const oend = args->oend;
    BYTE const* const ilimit = args->ilimit;

    /* Copy the arguments to local variables */
    ZSTD_memcpy(&bits, &args->bits, sizeof(bits));
    ZSTD_memcpy((void*)(&ip), &args->ip, sizeof(ip));
    ZSTD_memcpy(&op, &args->op, sizeof(op));

    assert(MEM_isLittleEndian());
    assert(!MEM_32bits());

    for (;;) {
        BYTE* olimit;
        int stream;
        int symbol;

        /* Assert loop preconditions */
#ifndef NDEBUG
        for (stream = 0; stream < 4; ++stream) {
            assert(op[stream] <= (stream == 3 ? oend : op[stream + 1]));
            assert(ip[stream] >= ilimit);
        }
#endif
        /* Compute olimit */
        {
            /* Each iteration produces 5 output symbols per stream */
            size_t const oiters = (size_t)(oend - op[3]) / 5;
            /* Each iteration consumes up to 11 bits * 5 = 55 bits < 7 bytes
             * per stream.
             */
            size_t const iiters = (size_t)(ip[0] - ilimit) / 7;
            /* We can safely run iters iterations before running bounds checks */
            size_t const iters = MIN(oiters, iiters);
            size_t const symbols = iters * 5;

            /* We can simply check that op[3] < olimit, instead of checking all
             * of our bounds, since we can't hit the other bounds until we've run
             * iters iterations, which only happens when op[3] == olimit.
             */
            olimit = op[3] + symbols;

            /* Exit fast decoding loop once we get close to the end. */
            if (op[3] + 20 > olimit)
                break;

            /* Exit the decoding loop if any input pointer has crossed the
             * previous one. This indicates corruption, and a precondition
             * to our loop is that ip[i] >= ip[0].
             */
            for (stream = 1; stream < 4; ++stream) {
                if (ip[stream] < ip[stream - 1])
                    goto _out;
            }
        }

#ifndef NDEBUG
        for (stream = 1; stream < 4; ++stream) {
            assert(ip[stream] >= ip[stream - 1]);
        }
#endif

        do {
            /* Decode 5 symbols in each of the 4 streams */
            for (symbol = 0; symbol < 5; ++symbol) {
                for (stream = 0; stream < 4; ++stream) {
                    int const index = (int)(bits[stream] >> 53);
                    int const entry = (int)dtable[index];
                    bits[stream] <<= (entry & 63);
                    op[stream][symbol] = (BYTE)((entry >> 8) & 0xFF);
                }
            }
            /* Reload the bitstreams */
            for (stream = 0; stream < 4; ++stream) {
                int const ctz = ZSTD_countTrailingZeros64(bits[stream]);
                int const nbBits = ctz & 7;
                int const nbBytes = ctz >> 3;
                op[stream] += 5;
                ip[stream] -= nbBytes;
                bits[stream] = MEM_read64(ip[stream]) | 1;
                bits[stream] <<= nbBits;
            }
        } while (op[3] < olimit);
    }

_out:

    /* Save the final values of each of the state variables back to args. */
    ZSTD_memcpy(&args->bits, &bits, sizeof(bits));
    ZSTD_memcpy((void*)(&args->ip), &ip, sizeof(ip));
    ZSTD_memcpy(&args->op, &op, sizeof(op));
}